

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonutils.cpp
# Opt level: O0

ModelPtr owningModel(ParentedEntityConstPtr *entity)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  ModelPtr MVar2;
  bool local_a9;
  shared_ptr<const_libcellml::ParentedEntity> local_90;
  ParentedEntityConstPtr local_80;
  shared_ptr<libcellml::ParentedEntity> local_70;
  shared_ptr<libcellml::Model> local_60 [2];
  undefined1 local_40 [8];
  ComponentPtr component;
  ParentedEntityConstPtr *entity_local;
  shared_ptr<libcellml::Model> *model;
  
  std::
  __shared_ptr_access<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_RSI);
  libcellml::ParentedEntity::parent();
  std::dynamic_pointer_cast<libcellml::Model,libcellml::ParentedEntity>
            ((shared_ptr<libcellml::ParentedEntity> *)entity);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr
            ((shared_ptr<libcellml::ParentedEntity> *)
             &component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  owningComponent((ParentedEntityConstPtr *)local_40);
  while( true ) {
    bVar1 = std::operator==((shared_ptr<libcellml::Model> *)entity,(nullptr_t)0x0);
    local_a9 = false;
    if (bVar1) {
      local_a9 = std::operator!=((shared_ptr<libcellml::Component> *)local_40,(nullptr_t)0x0);
    }
    if (local_a9 == false) break;
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_40);
    libcellml::ParentedEntity::parent();
    std::dynamic_pointer_cast<libcellml::Model,libcellml::ParentedEntity>
              ((shared_ptr<libcellml::ParentedEntity> *)local_60);
    std::shared_ptr<libcellml::Model>::operator=((shared_ptr<libcellml::Model> *)entity,local_60);
    std::shared_ptr<libcellml::Model>::~shared_ptr(local_60);
    std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_70);
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::ParentedEntity_const> *)&local_90,
               (shared_ptr<libcellml::Component> *)local_40);
    owningComponent(&local_80);
    std::shared_ptr<libcellml::Component>::operator=
              ((shared_ptr<libcellml::Component> *)local_40,
               (shared_ptr<libcellml::Component> *)&local_80);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_80);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_90);
  }
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_40);
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entity;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr owningModel(const libcellml::ParentedEntityConstPtr &entity)
{
    auto model = std::dynamic_pointer_cast<libcellml::Model>(entity->parent());
    auto component = owningComponent(entity);
    while ((model == nullptr) && (component != nullptr)) {
        model = std::dynamic_pointer_cast<libcellml::Model>(component->parent());
        component = owningComponent(component);
    }

    return model;
}